

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidates
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  pointer *__args;
  pointer pbVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *w;
  pointer pbVar2;
  undefined1 auVar3 [8];
  undefined1 auStack_98 [8];
  TWords words;
  undefined1 local_78 [8];
  TWords candidates;
  TWord local_50;
  size_t local_40;
  TSpellCorrector *local_38;
  
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pbVar1 = (sentence->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = position;
  local_38 = this;
  for (pbVar2 = (sentence->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar2->_M_dataplus)._M_p;
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::emplace_back<NJamSpell::TWord>
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_98,
               (TWord *)&candidates.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  GetCandidatesRaw((TWords *)local_78,local_38,(TWords *)auStack_98,local_40);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  for (auVar3 = local_78;
      auVar3 != (undefined1  [8])
                candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                _M_impl.super__Vector_impl_data._M_start;
      auVar3 = (undefined1  [8])((long)auVar3 + 0x10)) {
    candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &local_50;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)__args,((pointer)auVar3)->Ptr,
               ((pointer)auVar3)->Ptr + ((pointer)auVar3)->Len);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
               __return_storage_ptr__,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)__args)
    ;
    std::__cxx11::wstring::~wstring((wstring *)__args);
  }
  std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
            ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_78);
  std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
            ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::wstring> TSpellCorrector::GetCandidates(const std::vector<std::wstring>& sentence, size_t position) const {
    TWords words;
    for (auto&& w: sentence) {
        words.push_back(TWord(w));
    }
    TWords candidates = GetCandidatesRaw(words, position);
    std::vector<std::wstring> results;
    for (auto&& c: candidates) {
        results.push_back(std::wstring(c.Ptr, c.Len));
    }
    return results;
}